

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
          (optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *this,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *v)

{
  undefined8 uVar1;
  
  this->set = v->set;
  if (v->set == true) {
    (this->optionalValue).__align = (v->optionalValue).__align;
    *(undefined8 *)((long)&this->optionalValue + 8) = 0;
    *(undefined8 *)((long)&this->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&this->optionalValue + 0x18) = 0;
    uVar1 = *(undefined8 *)((long)&v->optionalValue + 0x18);
    *(undefined8 *)((long)&this->optionalValue + 0x10) =
         *(undefined8 *)((long)&v->optionalValue + 0x10);
    *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar1;
    *(undefined8 *)((long)&this->optionalValue + 8) = *(undefined8 *)((long)&v->optionalValue + 8);
    *(undefined8 *)((long)&v->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&v->optionalValue + 8) = 0;
    *(undefined8 *)((long)&v->optionalValue + 0x10) = 0;
    *(undefined4 *)((long)&this->optionalValue + 0x28) =
         *(undefined4 *)((long)&v->optionalValue + 0x28);
    *(undefined8 *)((long)&this->optionalValue + 0x20) =
         *(undefined8 *)((long)&v->optionalValue + 0x20);
    if (v->set == true) {
      vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
      ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
                 *)v);
      v->set = false;
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }